

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_hdr(char *filename,int x,int y,int comp,float *data)

{
  int iVar1;
  int r;
  stbi__write_context s;
  float *in_stack_000000c0;
  int in_stack_000000cc;
  int in_stack_000000d0;
  int in_stack_000000d4;
  stbi__write_context *in_stack_000000d8;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 local_4;
  
  iVar1 = stbi__start_write_file
                    ((stbi__write_context *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    local_4 = stbi_write_hdr_core(in_stack_000000d8,in_stack_000000d4,in_stack_000000d0,
                                  in_stack_000000cc,in_stack_000000c0);
    stbi__end_write_file((stbi__write_context *)0x282ce7);
  }
  return local_4;
}

Assistant:

STBIWDEF int stbi_write_hdr(char const *filename, int x, int y, int comp, const float *data)
{
   stbi__write_context s;
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_hdr_core(&s, x, y, comp, (float *) data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}